

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::Functions::GetComponent<tcu::Matrix<float,_2,_2>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Matrix<float,_2,_2>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  Interval *this_00;
  bool bVar1;
  Vector<tcu::Interval,_2> *a;
  IVal local_78;
  Interval local_48;
  int local_2c;
  IArgs *pIStack_28;
  int compNdx;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  GetComponent<tcu::Matrix<float,_2,_2>_> *this_local;
  IRet *ret;
  
  pIStack_28 = iargs;
  iargs_local = (IArgs *)param_1;
  param_1_local = (EvalContext *)this;
  this_local = (GetComponent<tcu::Matrix<float,_2,_2>_> *)__return_storage_ptr__;
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__);
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    this_00 = pIStack_28->b;
    tcu::Interval::Interval(&local_48,(double)local_2c);
    bVar1 = tcu::Interval::contains(this_00,&local_48);
    if (bVar1) {
      a = tcu::Matrix<tcu::Interval,_2,_2>::operator[](pIStack_28->a,local_2c);
      unionIVal<tcu::Vector<float,2>>
                (&local_78,(shaderexecutor *)__return_storage_ptr__,a,(IVal *)iargs);
      memcpy(__return_storage_ptr__,&local_78,0x30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}